

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBest(TaggerImpl *this,size_t N,char *str,size_t len)

{
  int iVar1;
  Lattice *pLVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  
  pLVar2 = mutable_lattice(this);
  (*pLVar2->_vptr_Lattice[10])(pLVar2,str,len);
  initRequestType(this);
  (*pLVar2->_vptr_Lattice[0x14])(pLVar2,2);
  iVar1 = (**(this->super_Tagger)._vptr_Tagger)(this,pLVar2);
  pp_Var3 = pLVar2->_vptr_Lattice;
  if ((char)iVar1 != '\0') {
    iVar1 = (*pp_Var3[0x1a])(pLVar2,N);
    if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
      return (char *)CONCAT44(extraout_var,iVar1);
    }
    pp_Var3 = pLVar2->_vptr_Lattice;
  }
  (*pp_Var3[0x24])(pLVar2);
  std::__cxx11::string::assign((char *)&this->what_);
  return (char *)0x0;
}

Assistant:

const char* TaggerImpl::parseNBest(size_t N,
                                   const char* str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);

  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }

  const char *result = lattice->enumNBestAsString(N);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}